

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

char * crnlib::strcpy_safe(char *pDst,uint dst_len,char *pSrc)

{
  char cVar1;
  char *pcStack_30;
  char c;
  char *q;
  char *pSrc_local;
  uint dst_len_local;
  char *pDst_local;
  
  pcStack_30 = pDst;
  q = pSrc;
  pSrc_local._4_4_ = dst_len;
  if (dst_len != 0) {
    do {
      if (pSrc_local._4_4_ == 1) {
        *pcStack_30 = '\0';
        return pDst;
      }
      cVar1 = *q;
      *pcStack_30 = cVar1;
      pSrc_local._4_4_ = pSrc_local._4_4_ - 1;
      pcStack_30 = pcStack_30 + 1;
      q = q + 1;
    } while (cVar1 != '\0');
  }
  return pDst;
}

Assistant:

char* strcpy_safe(char* pDst, uint dst_len, const char* pSrc)
    {
        CRNLIB_ASSERT(pDst && pSrc && dst_len);
        if (!dst_len)
        {
            return pDst;
        }

        char* q = pDst;
        char c;

        do
        {
            if (dst_len == 1)
            {
                *q++ = '\0';
                break;
            }

            c = *pSrc++;
            *q++ = c;

            dst_len--;

        } while (c);

        CRNLIB_ASSERT((q - pDst) <= (int)dst_len);

        return pDst;
    }